

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O2

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall
duckdb::DistinctStatistics::Deserialize(DistinctStatistics *this,Deserializer *deserializer)

{
  unsigned_long sample_count;
  unsigned_long total_count;
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> this_00;
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> log;
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_> local_28;
  
  sample_count = Deserializer::ReadPropertyWithDefault<unsigned_long>
                           (deserializer,100,"sample_count");
  total_count = Deserializer::ReadPropertyWithDefault<unsigned_long>
                          (deserializer,0x65,"total_count");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::HyperLogLog,std::default_delete<duckdb::HyperLogLog>,true>>
            ((Deserializer *)&log,(field_id_t)deserializer,(char *)0x66);
  this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::HyperLogLog_*,_false>)operator_new(0x18);
  local_28._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>)
       (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>)
       log.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
       super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
       super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl;
  log.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
       (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>)
       0x0;
  DistinctStatistics((DistinctStatistics *)
                     this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl,
                     (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                      *)&local_28,sample_count,total_count);
  (this->log).super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl;
  ::std::unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>::~unique_ptr
            (&local_28);
  ::std::unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>::~unique_ptr
            (&log.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>);
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

unique_ptr<DistinctStatistics> DistinctStatistics::Deserialize(Deserializer &deserializer) {
	auto sample_count = deserializer.ReadPropertyWithDefault<idx_t>(100, "sample_count");
	auto total_count = deserializer.ReadPropertyWithDefault<idx_t>(101, "total_count");
	auto log = deserializer.ReadPropertyWithDefault<unique_ptr<HyperLogLog>>(102, "log");
	auto result = duckdb::unique_ptr<DistinctStatistics>(new DistinctStatistics(std::move(log), sample_count, total_count));
	return result;
}